

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

char fsnav_reschedule_plugin(_func_void *plugin,int cycle,int shift)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  int *piVar7;
  
  iVar1 = -cycle;
  if (0 < cycle) {
    iVar1 = cycle;
  }
  if (cycle == 0) {
    iVar3 = 0;
  }
  else {
    iVar6 = -cycle;
    if (0 < cycle) {
      iVar6 = cycle;
    }
    iVar3 = shift + iVar6;
    iVar4 = -iVar3;
    do {
      iVar3 = iVar3 - iVar6;
      iVar4 = iVar4 + iVar6;
    } while (iVar1 <= iVar3);
    iVar1 = 0;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    iVar3 = (((iVar1 - (uint)(iVar1 != iVar3)) + iVar4) / (iVar6 + (uint)(iVar6 == 0)) +
            (uint)(iVar1 != iVar3)) * iVar6 + iVar3;
  }
  sVar5 = (fsnav->core).plugin_count;
  if (sVar5 == 0) {
    cVar2 = '\0';
  }
  else {
    piVar7 = &((fsnav->core).plugins)->tick;
    cVar2 = '\0';
    do {
      if (((fsnav_plugin *)(piVar7 + -4))->func == plugin) {
        piVar7[-2] = cycle;
        piVar7[-1] = iVar3;
        *piVar7 = 0;
        cVar2 = '\x01';
      }
      piVar7 = piVar7 + 6;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  return cVar2;
}

Assistant:

char fsnav_reschedule_plugin(void(*plugin)(void), int cycle, int shift)
{
	size_t i;
	int abs_cycle;
	char flag = 0;
	// shrink shift to [0..cycle-1]
	abs_cycle = abs(cycle);
	if (abs_cycle) {
		while (shift >= abs_cycle)
			shift -= abs_cycle;
		while (shift < 0)
			shift += abs_cycle;
	}
	else
		shift = 0;
	// go through execution list and set scheduling parameters, if found the plugin
	for (i = 0; i < fsnav->core.plugin_count; i++) {
		if (fsnav->core.plugins[i].func == plugin) {
			fsnav->core.plugins[i].cycle = cycle;
			fsnav->core.plugins[i].shift = shift;
			fsnav->core.plugins[i].tick  = 0;
			flag = 1;
		}
	}
	return flag;
}